

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

shared_ptr<Token> __thiscall
Parser::expect(Parser *this,TokenType type,bool *error,string *errorMessage)

{
  int iVar1;
  undefined1 *puVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  shared_ptr<Token> *in_R8;
  bool bVar4;
  shared_ptr<Token> sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  TokenBuffer local_68;
  shared_ptr<Token> *token;
  int local_34;
  
  local_34 = (int)error;
  bVar4 = false;
  local_68.tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  token = in_R8;
  do {
    TokenBuffer::currentToken(&local_68);
    if (*(int *)&local_68.tokenList.
                 super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>.
                 _M_impl._M_node.super__List_node_base._M_next[2]._M_next == 1) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&local_68.tokenList.
                         super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                         ._M_impl._M_node.super__List_node_base + 8));
    }
    else {
      TokenBuffer::currentToken((TokenBuffer *)local_98);
      iVar1 = *(int *)&((_List_node_base *)(local_98._0_8_ + 0x20))->_M_next;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&local_68.tokenList.
                         super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                         ._M_impl._M_node.super__List_node_base + 8));
      if (iVar1 == local_34) {
LAB_0010c039:
        _Var3._M_pi = local_68.tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        TokenBuffer::currentToken
                  ((TokenBuffer *)
                   local_68.tokenizer.super___shared_ptr<Tokenizer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        TokenBuffer::nextToken((TokenBuffer *)(local_c8 + 0x10));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
        sVar5.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             extraout_RDX._M_pi;
        sVar5.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)_Var3._M_pi;
        return (shared_ptr<Token>)sVar5.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>;
      }
    }
    *(undefined1 *)&(errorMessage->_M_dataplus)._M_p = 1;
    if (!bVar4) {
      TokenBuffer::currentToken(&local_68);
      iVar1 = *(int *)&local_68.tokenList.
                       super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next[2]._M_next;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&local_68.tokenList.
                         super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                         ._M_impl._M_node.super__List_node_base + 8));
      if (iVar1 == 1) {
        TokenBuffer::currentToken((TokenBuffer *)local_98);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)token,
                       ".");
        reportError((Parser *)CONCAT44(in_register_00000034,type),(shared_ptr<Token> *)local_98,
                    (string *)&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        puVar2 = local_98;
      }
      else {
        TokenBuffer::currentToken((TokenBuffer *)local_a8);
        std::operator+(&local_e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)token,
                       ", but was \'");
        TokenBuffer::currentToken((TokenBuffer *)(local_98 + 0x20));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,&local_e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_98._32_8_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,"\'.");
        reportError((Parser *)CONCAT44(in_register_00000034,type),(shared_ptr<Token> *)local_a8,
                    (string *)&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)local_98);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
        std::__cxx11::string::~string((string *)&local_e8);
        puVar2 = local_a8;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar2 + 8));
    }
    TokenBuffer::currentToken(&local_68);
    iVar1 = *(int *)&local_68.tokenList.
                     super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                     ._M_impl._M_node.super__List_node_base._M_next[2]._M_next;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_68.tokenList.
                       super__List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>
                       ._M_impl._M_node.super__List_node_base + 8));
    if (iVar1 == 1) goto LAB_0010c039;
    TokenBuffer::nextToken((TokenBuffer *)local_c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
    bVar4 = true;
  } while( true );
}

Assistant:

std::shared_ptr<Token>
Parser::expect(TokenType type, bool & error, const std::string & errorMessage) noexcept {
  bool foundWrongToken = false;

  while (true) {
    if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile
        || this->tokenBuffer->currentToken()->tokenType != type) {
      error = true;

      // if this is our first error, report it
      if (!foundWrongToken) {
        if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
          this->reportError(this->tokenBuffer->currentToken(), errorMessage + ".");
        } else {
          this->reportError(this->tokenBuffer->currentToken(),
            errorMessage + ", but was '" + this->tokenBuffer->currentToken()->value + "'.");
        }
      }

      foundWrongToken = true;

      if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
        break;
      }

      this->tokenBuffer->nextToken();

    } else {
      break;
    }
  }

  auto token = this->tokenBuffer->currentToken();

  this->tokenBuffer->nextToken();

  return token;
}